

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMinDown
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  ushort uVar2;
  cbtOverlappingPairCallback *pcVar3;
  long lVar4;
  bool bVar5;
  Edge EVar6;
  uint axis0;
  long lVar7;
  undefined6 in_register_00000012;
  long lVar8;
  Handle *pHandleB;
  Handle *pHandleA;
  Edge *pEVar9;
  int axis2;
  int axis1;
  
  lVar8 = (long)axis;
  pEVar9 = this->m_pEdges[lVar8] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  pHandleA = this->m_pHandles + pEVar9->m_handle;
  axis0 = 1 << (axis & 0x1fU) & 3;
  EVar6.m_handle = 0;
  EVar6.m_pos = pEVar9->m_pos;
  lVar4 = 0x3a;
  for (; uVar2 = pEVar9[-1].m_pos, EVar6.m_pos < uVar2; pEVar9 = pEVar9 + -1) {
    pHandleB = this->m_pHandles + pEVar9[-1].m_handle;
    lVar7 = 0x34;
    if ((uVar2 & 1) != 0) {
      lVar7 = lVar4;
    }
    if (((byte)uVar2 & 1 & updateOverlaps) == 1) {
      bVar5 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << axis0 & 3);
      lVar7 = lVar4;
      if (bVar5) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,pHandleA,pHandleB);
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[2])(pcVar3,pHandleA,pHandleB);
        }
      }
    }
    psVar1 = (short *)((long)(pHandleB->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                      lVar8 * 2 + lVar7 + -0x14);
    *psVar1 = *psVar1 + 1;
    pHandleA->m_maxEdges[lVar8 + -3] = pHandleA->m_maxEdges[lVar8 + -3] - 1;
    EVar6 = *pEVar9;
    *pEVar9 = pEVar9[-1];
    pEVar9[-1] = EVar6;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev, axis1, axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge, pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge, pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);
			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
}